

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockReturnValueTest.cpp
# Opt level: O0

void __thiscall
TEST_MockReturnValueTest_UnsignedIntegerReturnValueSetsDifferentValuesWhileParametersAreIgnored_TestShell
::
~TEST_MockReturnValueTest_UnsignedIntegerReturnValueSetsDifferentValuesWhileParametersAreIgnored_TestShell
          (TEST_MockReturnValueTest_UnsignedIntegerReturnValueSetsDifferentValuesWhileParametersAreIgnored_TestShell
           *this)

{
  TEST_MockReturnValueTest_UnsignedIntegerReturnValueSetsDifferentValuesWhileParametersAreIgnored_TestShell
  *this_local;
  
  ~TEST_MockReturnValueTest_UnsignedIntegerReturnValueSetsDifferentValuesWhileParametersAreIgnored_TestShell
            (this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(MockReturnValueTest, UnsignedIntegerReturnValueSetsDifferentValuesWhileParametersAreIgnored)
{
    unsigned int ret_value = 1;
    unsigned int another_ret_value = 2;

    mock().expectOneCall("foo").withParameter("p1", 1).ignoreOtherParameters().andReturnValue(ret_value);
    mock().expectOneCall("foo").withParameter("p1", 1).ignoreOtherParameters().andReturnValue(another_ret_value);

    LONGS_EQUAL(ret_value, mock().actualCall("foo").withParameter("p1", 1).returnValue().getUnsignedIntValue());
    LONGS_EQUAL(ret_value, mock().returnValue().getUnsignedIntValue());
    LONGS_EQUAL(another_ret_value, mock().actualCall("foo").withParameter("p1", 1).returnValue().getUnsignedIntValue());
    LONGS_EQUAL(another_ret_value, mock().returnValue().getUnsignedIntValue());
}